

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_merge.cpp
# Opt level: O2

void __thiscall BamTools::MergeTool::~MergeTool(MergeTool *this)

{
  MergeSettings *this_00;
  
  (this->super_AbstractTool)._vptr_AbstractTool = (_func_int **)&PTR__MergeTool_001f2118;
  this_00 = this->m_settings;
  if (this_00 != (MergeSettings *)0x0) {
    MergeSettings::~MergeSettings(this_00);
  }
  operator_delete(this_00);
  this->m_settings = (MergeSettings *)0x0;
  operator_delete(this->m_impl);
  this->m_impl = (MergeToolPrivate *)0x0;
  return;
}

Assistant:

MergeTool::~MergeTool()
{

    delete m_settings;
    m_settings = 0;

    delete m_impl;
    m_impl = 0;
}